

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O3

void __thiscall
features::Sift::add_octave(Sift *this,ConstPtr *image,float has_sigma,float target_sigma)

{
  int *piVar1;
  element_type *peVar2;
  pointer pOVar3;
  Image<float> *__p;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined1 auStack_108 [8];
  Ptr img;
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  vStack_f0;
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  local_d8;
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  vStack_c0;
  image local_a0 [8];
  Ptr dog;
  ConstPtr local_88;
  ConstPtr local_78;
  ConstPtr local_68;
  ConstPtr local_58;
  undefined1 local_48 [8];
  Ptr base;
  
  fVar5 = target_sigma * target_sigma - has_sigma * has_sigma;
  base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       target_sigma;
  if (fVar5 < 0.0) {
    base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = has_sigma;
    fVar5 = sqrtf(fVar5);
    has_sigma = base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  peVar2 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ <= has_sigma) {
    __p = (Image<float> *)operator_new(0x30);
    iVar4 = (peVar2->super_TypedImageBase<float>).super_ImageBase.h;
    (__p->super_TypedImageBase<float>).super_ImageBase.w =
         (peVar2->super_TypedImageBase<float>).super_ImageBase.w;
    (__p->super_TypedImageBase<float>).super_ImageBase.h = iVar4;
    (__p->super_TypedImageBase<float>).super_ImageBase.c =
         (peVar2->super_TypedImageBase<float>).super_ImageBase.c;
    (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_00128be8;
    std::vector<float,_std::allocator<float>_>::vector
              (&(__p->super_TypedImageBase<float>).data,&(peVar2->super_TypedImageBase<float>).data)
    ;
    (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_00128b60;
    local_48 = (undefined1  [8])__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&base,__p);
  }
  else {
    local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    core::image::blur_gaussian<float>((image *)local_48,&local_88,fVar5);
    if (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  vStack_c0.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_c0.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_c0.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f0.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f0.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  vStack_f0.
  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
  emplace_back<features::Sift::Octave>(&this->octaves,(Octave *)auStack_108);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::~vector(&vStack_c0);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::~vector(&vStack_f0);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::~vector((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
             *)auStack_108);
  pOVar3 = (this->octaves).
           super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pOVar3 + -1);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::push_back((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               *)dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,(value_type *)local_48);
  base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       exp2f(1.0 / (float)(this->options).num_samples_per_octave);
  if (-2 < (this->options).num_samples_per_octave) {
    iVar4 = 0;
    do {
      fVar5 = base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ *
              base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_;
      fVar6 = fVar5 * fVar5 -
              base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ *
              base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_;
      base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = fVar5;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_48;
      local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = &((base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        else {
          piVar1 = &((base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
        }
      }
      core::image::blur_gaussian<float>((image *)auStack_108,&local_78,fVar6);
      if (local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::push_back((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   *)dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,(value_type *)auStack_108);
      local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auStack_108;
      local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = &((img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        else {
          piVar1 = &((img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
        }
      }
      local_58.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_48;
      local_58.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = &((base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        else {
          piVar1 = &((base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->super_TypedImageBase<float>).super_ImageBase.w;
          *piVar1 = *piVar1 + 1;
        }
      }
      core::image::subtract<float>(local_a0,&local_68,&local_58);
      if (local_58.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::push_back(&pOVar3[-1].dog,(value_type *)local_a0);
      local_48 = auStack_108;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&base,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
      if (dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (this->options).num_samples_per_octave + 2);
  }
  if (base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void
Sift::add_octave (core::FloatImage::ConstPtr image,
        float has_sigma, float target_sigma)
{
    /*
     * First, bring the provided image to the target blur.
     * Since L * g(sigma1) * g(sigma2) = L * g(sqrt(sigma1^2 + sigma2^2)),
     * we need to blur with sigma = sqrt(target_sigma^2 - has_sigma^2).
     */
    float sigma = std::sqrt(MATH_POW2(target_sigma) - MATH_POW2(has_sigma));
    //std::cout << "Pre-blurring image to sigma " << target_sigma << " (has "
    //    << has_sigma << ", blur = " << sigma << ")..." << std::endl;
    core::FloatImage::Ptr base = (target_sigma > has_sigma
        ? core::image::blur_gaussian<float>(image, sigma)
        : image->duplicate());

    /* Create the new octave and add initial image. */
    this->octaves.push_back(Octave());
    Octave& oct = this->octaves.back();
    oct.img.push_back(base);

    /* 'k' is the constant factor between the scales in scale space. */
    float const k = std::pow(2.0f, 1.0f / this->options.num_samples_per_octave);
    sigma = target_sigma;

    /* Create other (s+2) samples of the octave to get a total of (s+3). */
    for (int i = 1; i < this->options.num_samples_per_octave + 3; ++i)
    {
        /* Calculate the blur sigma the image will get. */
        float sigmak = sigma * k;
        float blur_sigma = std::sqrt(MATH_POW2(sigmak) - MATH_POW2(sigma));

        /* Blur the image to create a new scale space sample. */
        //std::cout << "Blurring image to sigma " << sigmak << " (has " << sigma
        //    << ", blur = " << blur_sigma << ")..." << std::endl;
        core::FloatImage::Ptr img = core::image::blur_gaussian<float>
            (base, blur_sigma);
        oct.img.push_back(img);

        /* Create the Difference of Gaussian image (DoG). */
        //计算差分拉普拉斯 // todo revised by sway
        core::FloatImage::Ptr dog = core::image::subtract<float>(img, base);
        oct.dog.push_back(dog);

        /* Update previous image and sigma for next round. */
        base = img;
        sigma = sigmak;
    }
}